

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall CRegexParser::build_char(CRegexParser *this,re_machine *machine,wchar_t ch)

{
  wchar_t in_EDX;
  re_state_id *in_RSI;
  CRegexParser *in_RDI;
  re_machine *in_stack_ffffffffffffffd8;
  
  init_machine(in_RDI,in_stack_ffffffffffffffd8);
  set_trans(in_RDI,*in_RSI,in_RSI[1],RE_LITERAL,in_EDX);
  return;
}

Assistant:

void CRegexParser::build_char(re_machine *machine, wchar_t ch)
{
    /* initialize our new machine */
    init_machine(machine);

    /* allocate a transition tuple for the new state */
    set_trans(machine->init, machine->final, RE_LITERAL, ch);
}